

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_1.c
# Opt level: O1

void amd_l1(longlong n,longlong *Ap,longlong *Ai,longlong *P,longlong *Pinv,longlong *Len,
           longlong slen,longlong *S,c_float *Control,c_float *Info)

{
  longlong *Nv;
  longlong *Head;
  longlong *Elen;
  longlong *W;
  longlong *Iw;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  longlong pfree;
  long lVar6;
  long lVar7;
  long lVar8;
  
  Nv = S + n;
  Head = Nv + n;
  Elen = Head + n;
  W = Elen + n + n;
  if (n < 1) {
    pfree = 0;
  }
  else {
    lVar3 = 0;
    pfree = 0;
    do {
      S[lVar3] = pfree;
      Nv[lVar3] = pfree;
      pfree = pfree + Len[lVar3];
      lVar3 = lVar3 + 1;
    } while (n != lVar3);
  }
  Iw = W + n;
  if (0 < n) {
    lVar3 = 0;
    do {
      lVar4 = Ap[lVar3];
      lVar8 = Ap[lVar3 + 1];
      lVar5 = lVar4;
      if (lVar4 < lVar8) {
        do {
          lVar5 = Ai[lVar4];
          if (lVar3 <= lVar5) {
            lVar5 = lVar4 + (ulong)(lVar5 == lVar3);
            break;
          }
          lVar1 = Nv[lVar5];
          Nv[lVar5] = lVar1 + 1;
          Iw[lVar1] = lVar3;
          lVar1 = Nv[lVar3];
          Nv[lVar3] = lVar1 + 1;
          Iw[lVar1] = lVar5;
          lVar1 = Ap[lVar5 + 1];
          lVar6 = W[lVar5];
          lVar7 = lVar6;
          if (lVar6 < lVar1) {
            do {
              lVar7 = Ai[lVar6];
              if (lVar3 <= lVar7) {
                lVar7 = lVar6 + (ulong)(lVar7 == lVar3);
                break;
              }
              lVar2 = Nv[lVar7];
              Nv[lVar7] = lVar2 + 1;
              Iw[lVar2] = lVar5;
              lVar2 = Nv[lVar5];
              Nv[lVar5] = lVar2 + 1;
              Iw[lVar2] = lVar7;
              lVar6 = lVar6 + 1;
              lVar7 = lVar1;
            } while (lVar1 != lVar6);
          }
          lVar4 = lVar4 + 1;
          W[lVar5] = lVar7;
          lVar5 = lVar8;
        } while (lVar4 != lVar8);
      }
      W[lVar3] = lVar5;
      lVar3 = lVar3 + 1;
    } while (lVar3 != n);
  }
  if (0 < n) {
    lVar3 = 0;
    do {
      lVar4 = W[lVar3];
      lVar8 = lVar3 + 1;
      if (lVar4 < Ap[lVar3 + 1]) {
        do {
          lVar5 = Ai[lVar4];
          lVar1 = Nv[lVar5];
          Nv[lVar5] = lVar1 + 1;
          Iw[lVar1] = lVar3;
          lVar1 = Nv[lVar3];
          Nv[lVar3] = lVar1 + 1;
          Iw[lVar1] = lVar5;
          lVar4 = lVar4 + 1;
        } while (lVar4 < Ap[lVar8]);
      }
      lVar3 = lVar8;
    } while (lVar8 != n);
  }
  amd_l2(n,S,Iw,Len,slen + n * -6,pfree,Nv,Pinv,P,Head,Elen,Elen + n,W,Control,Info);
  return;
}

Assistant:

GLOBAL void AMD_1
(
    Int n,		/* n > 0 */
    const Int Ap [ ],	/* input of size n+1, not modified */
    const Int Ai [ ],	/* input of size nz = Ap [n], not modified */
    Int P [ ],		/* size n output permutation */
    Int Pinv [ ],	/* size n output inverse permutation */
    Int Len [ ],	/* size n input, undefined on output */
    Int slen,		/* slen >= sum (Len [0..n-1]) + 7n,
			 * ideally slen = 1.2 * sum (Len) + 8n */
    Int S [ ],		/* size slen workspace */
    c_float Control [ ],	/* input array of size AMD_CONTROL */
    c_float Info [ ]	/* output array of size AMD_INFO */
)
{
    Int i, j, k, p, pfree, iwlen, pj, p1, p2, pj2, *Iw, *Pe, *Nv, *Head,
	*Elen, *Degree, *s, *W, *Sp, *Tp ;

    /* --------------------------------------------------------------------- */
    /* construct the matrix for AMD_2 */
    /* --------------------------------------------------------------------- */

    ASSERT (n > 0) ;

    iwlen = slen - 6*n ;
    s = S ;
    Pe = s ;	    s += n ;
    Nv = s ;	    s += n ;
    Head = s ;	    s += n ;
    Elen = s ;	    s += n ;
    Degree = s ;    s += n ;
    W = s ;	    s += n ;
    Iw = s ;	    s += iwlen ;

    ASSERT (AMD_valid (n, n, Ap, Ai) == AMD_OK) ;

    /* construct the pointers for A+A' */
    Sp = Nv ;			/* use Nv and W as workspace for Sp and Tp [ */
    Tp = W ;
    pfree = 0 ;
    for (j = 0 ; j < n ; j++)
    {
	Pe [j] = pfree ;
	Sp [j] = pfree ;
	pfree += Len [j] ;
    }

    /* Note that this restriction on iwlen is slightly more restrictive than
     * what is strictly required in AMD_2.  AMD_2 can operate with no elbow
     * room at all, but it will be very slow.  For better performance, at
     * least size-n elbow room is enforced. */
    ASSERT (iwlen >= pfree + n) ;

#ifndef NDEBUG
    for (p = 0 ; p < iwlen ; p++) Iw [p] = EMPTY ;
#endif

    for (k = 0 ; k < n ; k++)
    {
	AMD_DEBUG1 (("Construct row/column k= "ID" of A+A'\n", k))  ;
	p1 = Ap [k] ;
	p2 = Ap [k+1] ;

	/* construct A+A' */
	for (p = p1 ; p < p2 ; )
	{
	    /* scan the upper triangular part of A */
	    j = Ai [p] ;
	    ASSERT (j >= 0 && j < n) ;
	    if (j < k)
	    {
		/* entry A (j,k) in the strictly upper triangular part */
		ASSERT (Sp [j] < (j == n-1 ? pfree : Pe [j+1])) ;
		ASSERT (Sp [k] < (k == n-1 ? pfree : Pe [k+1])) ;
		Iw [Sp [j]++] = k ;
		Iw [Sp [k]++] = j ;
		p++ ;
	    }
	    else if (j == k)
	    {
		/* skip the diagonal */
		p++ ;
		break ;
	    }
	    else /* j > k */
	    {
		/* first entry below the diagonal */
		break ;
	    }
	    /* scan lower triangular part of A, in column j until reaching
	     * row k.  Start where last scan left off. */
	    ASSERT (Ap [j] <= Tp [j] && Tp [j] <= Ap [j+1]) ;
	    pj2 = Ap [j+1] ;
	    for (pj = Tp [j] ; pj < pj2 ; )
	    {
		i = Ai [pj] ;
		ASSERT (i >= 0 && i < n) ;
		if (i < k)
		{
		    /* A (i,j) is only in the lower part, not in upper */
		    ASSERT (Sp [i] < (i == n-1 ? pfree : Pe [i+1])) ;
		    ASSERT (Sp [j] < (j == n-1 ? pfree : Pe [j+1])) ;
		    Iw [Sp [i]++] = j ;
		    Iw [Sp [j]++] = i ;
		    pj++ ;
		}
		else if (i == k)
		{
		    /* entry A (k,j) in lower part and A (j,k) in upper */
		    pj++ ;
		    break ;
		}
		else /* i > k */
		{
		    /* consider this entry later, when k advances to i */
		    break ;
		}
	    }
	    Tp [j] = pj ;
	}
	Tp [k] = p ;
    }

    /* clean up, for remaining mismatched entries */
    for (j = 0 ; j < n ; j++)
    {
	for (pj = Tp [j] ; pj < Ap [j+1] ; pj++)
	{
	    i = Ai [pj] ;
	    ASSERT (i >= 0 && i < n) ;
	    /* A (i,j) is only in the lower part, not in upper */
	    ASSERT (Sp [i] < (i == n-1 ? pfree : Pe [i+1])) ;
	    ASSERT (Sp [j] < (j == n-1 ? pfree : Pe [j+1])) ;
	    Iw [Sp [i]++] = j ;
	    Iw [Sp [j]++] = i ;
	}
    }

#ifndef NDEBUG
    for (j = 0 ; j < n-1 ; j++) ASSERT (Sp [j] == Pe [j+1]) ;
    ASSERT (Sp [n-1] == pfree) ;
#endif

    /* Tp and Sp no longer needed ] */

    /* --------------------------------------------------------------------- */
    /* order the matrix */
    /* --------------------------------------------------------------------- */

    AMD_2 (n, Pe, Iw, Len, iwlen, pfree,
	Nv, Pinv, P, Head, Elen, Degree, W, Control, Info) ;
}